

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeNaN.cpp
# Opt level: O0

void __thiscall wasm::DeNaN::visitFunction(DeNaN *this,Function *func)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  initializer_list<wasm::Expression_*> __l_01;
  Name target_01;
  uint uVar1;
  bool bVar2;
  Module *pMVar3;
  Call *pCVar4;
  Block *pBVar5;
  PassOptions *pPVar6;
  optional<wasm::Type> type;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  allocator<char> local_381;
  string local_380;
  PassOptions local_360;
  undefined1 local_2a8 [8];
  PassRunner runner;
  undefined1 local_1b0 [12];
  Type local_1a0;
  allocator<wasm::Expression_*> local_191;
  Type local_190;
  LocalGet *local_188;
  LocalGet **local_180;
  size_type local_178;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_170;
  size_t local_158;
  char *pcStack_150;
  LocalSet *local_148;
  BasicType local_13c;
  Type local_138;
  Type local_130;
  allocator<wasm::Expression_*> local_121;
  Type local_120;
  LocalGet *local_118;
  LocalGet **local_110;
  size_type local_108;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_100;
  size_t local_e8;
  char *pcStack_e0;
  LocalSet *local_d8;
  BasicType local_cc;
  Type local_c8;
  Type local_c0;
  allocator<wasm::Expression_*> local_b1;
  Type local_b0;
  LocalGet *local_a8;
  LocalGet **local_a0;
  size_type local_98;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_90;
  size_t local_78;
  char *pcStack_70;
  LocalSet *local_68;
  BasicType local_5c;
  Type local_58;
  uint local_50;
  Index i;
  ulong local_40;
  size_t num;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> fixes;
  Builder builder;
  Function *func_local;
  DeNaN *this_local;
  
  bVar2 = Importable::imported(&func->super_Importable);
  if (!bVar2) {
    pMVar3 = Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>::getModule
                       ((Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_> *)
                        &(this->
                         super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
                         ).
                         super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>
                       );
    Builder::Builder((Builder *)
                     &fixes.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,pMVar3);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
    local_40 = Function::getNumParams(func);
    for (local_50 = 0; local_50 < local_40; local_50 = local_50 + 1) {
      local_58 = Function::getLocalType(func,local_50);
      local_5c = f32;
      bVar2 = wasm::Type::operator==(&local_58,&local_5c);
      uVar1 = local_50;
      if (bVar2) {
        local_78 = (this->deNan32).super_IString.str._M_len;
        pcStack_70 = (this->deNan32).super_IString.str._M_str;
        wasm::Type::Type(&local_b0,f32);
        local_a8 = Builder::makeLocalGet
                             ((Builder *)
                              &fixes.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,local_b0);
        local_a0 = &local_a8;
        local_98 = 1;
        std::allocator<wasm::Expression_*>::allocator(&local_b1);
        __l_01._M_len = local_98;
        __l_01._M_array = (iterator)local_a0;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                  (&local_90,__l_01,&local_b1);
        wasm::Type::Type(&local_c0,f32);
        target_01.super_IString.str._M_str = pcStack_70;
        target_01.super_IString.str._M_len = local_78;
        pCVar4 = Builder::makeCall((Builder *)
                                   &fixes.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,target_01,
                                   &local_90,local_c0,false);
        local_68 = Builder::makeLocalSet
                             ((Builder *)
                              &fixes.
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,
                              (Expression *)pCVar4);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,
                   (value_type *)&local_68);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_90);
        std::allocator<wasm::Expression_*>::~allocator(&local_b1);
      }
      else {
        local_c8 = Function::getLocalType(func,local_50);
        local_cc = f64;
        bVar2 = wasm::Type::operator==(&local_c8,&local_cc);
        uVar1 = local_50;
        if (bVar2) {
          local_e8 = (this->deNan64).super_IString.str._M_len;
          pcStack_e0 = (this->deNan64).super_IString.str._M_str;
          wasm::Type::Type(&local_120,f64);
          local_118 = Builder::makeLocalGet
                                ((Builder *)
                                 &fixes.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,local_120
                                );
          local_110 = &local_118;
          local_108 = 1;
          std::allocator<wasm::Expression_*>::allocator(&local_121);
          __l_00._M_len = local_108;
          __l_00._M_array = (iterator)local_110;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    (&local_100,__l_00,&local_121);
          wasm::Type::Type(&local_130,f64);
          target_00.super_IString.str._M_str = pcStack_e0;
          target_00.super_IString.str._M_len = local_e8;
          pCVar4 = Builder::makeCall((Builder *)
                                     &fixes.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,target_00,
                                     &local_100,local_130,false);
          local_d8 = Builder::makeLocalSet
                               ((Builder *)
                                &fixes.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,
                                (Expression *)pCVar4);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,
                     (value_type *)&local_d8);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_100);
          std::allocator<wasm::Expression_*>::~allocator(&local_121);
        }
        else {
          local_138 = Function::getLocalType(func,local_50);
          local_13c = v128;
          bVar2 = wasm::Type::operator==(&local_138,&local_13c);
          uVar1 = local_50;
          if (bVar2) {
            local_158 = (this->deNan128).super_IString.str._M_len;
            pcStack_150 = (this->deNan128).super_IString.str._M_str;
            wasm::Type::Type(&local_190,v128);
            local_188 = Builder::makeLocalGet
                                  ((Builder *)
                                   &fixes.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,
                                   local_190);
            local_180 = &local_188;
            local_178 = 1;
            std::allocator<wasm::Expression_*>::allocator(&local_191);
            __l._M_len = local_178;
            __l._M_array = (iterator)local_180;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                      (&local_170,__l,&local_191);
            wasm::Type::Type(&local_1a0,v128);
            target.super_IString.str._M_str = pcStack_150;
            target.super_IString.str._M_len = local_158;
            pCVar4 = Builder::makeCall((Builder *)
                                       &fixes.
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,target,
                                       &local_170,local_1a0,false);
            local_148 = Builder::makeLocalSet
                                  ((Builder *)
                                   &fixes.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar1,
                                   (Expression *)pCVar4);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,
                       (value_type *)&local_148);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                      (&local_170);
            std::allocator<wasm::Expression_*>::~allocator(&local_191);
          }
        }
      }
    }
    bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
    if (!bVar2) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,&func->body
                );
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_1b0);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_1b0._0_8_;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1b0[8];
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_1b0._9_3_;
      pBVar5 = Builder::
               makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                         ((Builder *)
                          &fixes.
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num,
                          type);
      func->body = (Expression *)pBVar5;
      pMVar3 = Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>::getModule
                         ((Walker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_> *
                          )&(this->
                            super_WalkerPass<wasm::ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>_>
                            ).
                            super_ControlFlowWalker<wasm::DeNaN,_wasm::UnifiedExpressionVisitor<wasm::DeNaN,_void>_>
                         );
      pPVar6 = Pass::getPassOptions((Pass *)this);
      PassOptions::PassOptions(&local_360,pPVar6);
      PassRunner::PassRunner((PassRunner *)local_2a8,pMVar3,&local_360);
      PassOptions::~PassOptions(&local_360);
      PassRunner::setIsNested((PassRunner *)local_2a8,true);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"merge-blocks",&local_381);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_2a8,&local_380,&local_3b0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_3b0);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator(&local_381);
      PassRunner::run((PassRunner *)local_2a8);
      PassRunner::~PassRunner((PassRunner *)local_2a8);
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&num);
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    // Instrument all locals as they enter the function.
    Builder builder(*getModule());
    std::vector<Expression*> fixes;
    auto num = func->getNumParams();
    for (Index i = 0; i < num; i++) {
      if (func->getLocalType(i) == Type::f32) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan32, {builder.makeLocalGet(i, Type::f32)}, Type::f32)));
      } else if (func->getLocalType(i) == Type::f64) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan64, {builder.makeLocalGet(i, Type::f64)}, Type::f64)));
      } else if (func->getLocalType(i) == Type::v128) {
        fixes.push_back(builder.makeLocalSet(
          i,
          builder.makeCall(
            deNan128, {builder.makeLocalGet(i, Type::v128)}, Type::v128)));
      }
    }
    if (!fixes.empty()) {
      fixes.push_back(func->body);
      func->body = builder.makeBlock(fixes);
      // Merge blocks so we don't add an unnecessary one.
      PassRunner runner(getModule(), getPassOptions());
      runner.setIsNested(true);
      runner.add("merge-blocks");
      runner.run();
    }
  }